

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcspn.c
# Opt level: O2

size_t strcspn(char *__s,char *__reject)

{
  char cVar1;
  size_t len;
  char *pcVar2;
  
  len = 0;
  do {
    pcVar2 = __reject;
    if (__s[len] == '\0') {
      return len;
    }
    while (cVar1 = *pcVar2, cVar1 != '\0') {
      pcVar2 = pcVar2 + 1;
      if (__s[len] == cVar1) {
        return len;
      }
    }
    len = len + 1;
  } while( true );
}

Assistant:

size_t strcspn( const char * s1, const char * s2 )
{
    size_t len = 0;
    const char * p;

    while ( s1[len] )
    {
        p = s2;

        while ( *p )
        {
            if ( s1[len] == *p++ )
            {
                return len;
            }
        }

        ++len;
    }

    return len;
}